

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_pedersen_blind_generator_blind_sum
              (secp256k1_context *ctx,uint64_t *value,uchar **generator_blind,
              uchar **blinding_factor,size_t n_total,size_t n_inputs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  int overflow;
  secp256k1_scalar tmp;
  secp256k1_scalar addend;
  uint64_t l [8];
  int local_104;
  uchar **local_100;
  size_t local_f8;
  uchar **local_f0;
  ulong local_e8;
  uint64_t *local_e0;
  secp256k1_scalar local_d8;
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  uint64_t local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined1 local_48 [16];
  
  local_100 = blinding_factor;
  local_f8 = n_inputs;
  local_e0 = value;
  if (value == (uint64_t *)0x0 && n_total != 0) {
    secp256k1_pedersen_blind_generator_blind_sum_cold_1();
  }
  else if (generator_blind == (uchar **)0x0 && n_total != 0) {
    secp256k1_pedersen_blind_generator_blind_sum_cold_2();
  }
  else if (blinding_factor == (uchar **)0x0 && n_total != 0) {
    secp256k1_pedersen_blind_generator_blind_sum_cold_3();
  }
  else if (n_inputs < n_total) {
    local_b8.d[2] = 0;
    local_b8.d[3] = 0;
    local_b8.d[0] = 0;
    local_b8.d[1] = 0;
    uVar41 = 0;
    local_f0 = generator_blind;
    local_e8 = n_total;
    while( true ) {
      local_104 = 0;
      local_98.d[0] = local_e0[uVar41];
      local_98.d[1] = 0;
      local_98.d[2] = 0;
      local_98.d[3] = 0;
      secp256k1_scalar_set_b32(&local_d8,generator_blind[uVar41],&local_104);
      uVar34 = local_e8;
      generator_blind = local_f0;
      if (local_104 == 1) break;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_98.d[0];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_d8.d[0];
      uVar36 = SUB168(auVar1 * auVar17,8);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar36;
      local_78 = SUB168(auVar1 * auVar17,0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_98.d[0];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_d8.d[1];
      auVar2 = auVar2 * auVar18;
      uVar42 = SUB168(auVar2 + auVar33,0);
      uVar47 = SUB168(auVar2 + auVar33,8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_98.d[1];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_d8.d[0];
      uVar37 = SUB168(auVar3 * auVar19,8);
      uVar35 = SUB168(auVar3 * auVar19,0);
      local_70 = uVar42 + uVar35;
      uVar35 = (ulong)CARRY8(uVar42,uVar35);
      uVar42 = uVar47 + uVar37;
      uVar48 = uVar42 + uVar35;
      uVar49 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar36,auVar2._0_8_)) +
               (ulong)(CARRY8(uVar47,uVar37) || CARRY8(uVar42,uVar35));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_98.d[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_d8.d[2];
      uVar38 = SUB168(auVar4 * auVar20,8);
      uVar35 = SUB168(auVar4 * auVar20,0);
      uVar36 = uVar48 + uVar35;
      uVar35 = (ulong)CARRY8(uVar48,uVar35);
      uVar37 = uVar49 + uVar38;
      uVar50 = uVar37 + uVar35;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_98.d[1];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_d8.d[1];
      uVar39 = SUB168(auVar5 * auVar21,8);
      uVar42 = SUB168(auVar5 * auVar21,0);
      uVar48 = uVar36 + uVar42;
      uVar42 = (ulong)CARRY8(uVar36,uVar42);
      uVar47 = uVar50 + uVar39;
      uVar51 = uVar47 + uVar42;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_98.d[2];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_d8.d[0];
      uVar40 = SUB168(auVar6 * auVar22,8);
      uVar36 = SUB168(auVar6 * auVar22,0);
      local_68 = uVar48 + uVar36;
      uVar36 = (ulong)CARRY8(uVar48,uVar36);
      uVar48 = uVar51 + uVar40;
      uVar52 = uVar48 + uVar36;
      uVar43 = (ulong)(CARRY8(uVar49,uVar38) || CARRY8(uVar37,uVar35)) +
               (ulong)(CARRY8(uVar50,uVar39) || CARRY8(uVar47,uVar42)) +
               (ulong)(CARRY8(uVar51,uVar40) || CARRY8(uVar48,uVar36));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_98.d[0];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_d8.d[3];
      uVar40 = SUB168(auVar7 * auVar23,8);
      uVar35 = SUB168(auVar7 * auVar23,0);
      uVar36 = uVar52 + uVar35;
      uVar35 = (ulong)CARRY8(uVar52,uVar35);
      uVar47 = uVar43 + uVar40;
      uVar52 = uVar47 + uVar35;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_98.d[1];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_d8.d[2];
      uVar49 = SUB168(auVar8 * auVar24,8);
      uVar42 = SUB168(auVar8 * auVar24,0);
      uVar37 = uVar36 + uVar42;
      uVar42 = (ulong)CARRY8(uVar36,uVar42);
      uVar48 = uVar52 + uVar49;
      uVar44 = uVar48 + uVar42;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_98.d[2];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_d8.d[1];
      uVar50 = SUB168(auVar9 * auVar25,8);
      uVar36 = SUB168(auVar9 * auVar25,0);
      uVar39 = uVar37 + uVar36;
      uVar36 = (ulong)CARRY8(uVar37,uVar36);
      uVar38 = uVar44 + uVar50;
      uVar45 = uVar38 + uVar36;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_98.d[3];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_d8.d[0];
      uVar51 = SUB168(auVar10 * auVar26,8);
      uVar37 = SUB168(auVar10 * auVar26,0);
      local_60 = uVar39 + uVar37;
      uVar37 = (ulong)CARRY8(uVar39,uVar37);
      uVar39 = uVar45 + uVar51;
      uVar46 = uVar39 + uVar37;
      uVar49 = (ulong)(CARRY8(uVar43,uVar40) || CARRY8(uVar47,uVar35)) +
               (ulong)(CARRY8(uVar52,uVar49) || CARRY8(uVar48,uVar42)) +
               (ulong)(CARRY8(uVar44,uVar50) || CARRY8(uVar38,uVar36)) +
               (ulong)(CARRY8(uVar45,uVar51) || CARRY8(uVar39,uVar37));
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_98.d[1];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_d8.d[3];
      uVar38 = SUB168(auVar11 * auVar27,8);
      uVar35 = SUB168(auVar11 * auVar27,0);
      uVar36 = uVar46 + uVar35;
      uVar35 = (ulong)CARRY8(uVar46,uVar35);
      uVar37 = uVar49 + uVar38;
      uVar50 = uVar37 + uVar35;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_98.d[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_d8.d[2];
      uVar39 = SUB168(auVar12 * auVar28,8);
      uVar42 = SUB168(auVar12 * auVar28,0);
      uVar48 = uVar36 + uVar42;
      uVar42 = (ulong)CARRY8(uVar36,uVar42);
      uVar47 = uVar50 + uVar39;
      uVar51 = uVar47 + uVar42;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_98.d[3];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_d8.d[1];
      uVar40 = SUB168(auVar13 * auVar29,8);
      uVar36 = SUB168(auVar13 * auVar29,0);
      local_58 = uVar48 + uVar36;
      uVar36 = (ulong)CARRY8(uVar48,uVar36);
      uVar48 = uVar51 + uVar40;
      uVar43 = uVar48 + uVar36;
      uVar38 = (ulong)(CARRY8(uVar49,uVar38) || CARRY8(uVar37,uVar35)) +
               (ulong)(CARRY8(uVar50,uVar39) || CARRY8(uVar47,uVar42)) +
               (ulong)(CARRY8(uVar51,uVar40) || CARRY8(uVar48,uVar36));
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_98.d[2];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_d8.d[3];
      uVar47 = SUB168(auVar14 * auVar30,8);
      uVar35 = SUB168(auVar14 * auVar30,0);
      uVar37 = uVar43 + uVar35;
      uVar35 = (ulong)CARRY8(uVar43,uVar35);
      uVar36 = uVar38 + uVar47;
      uVar39 = uVar36 + uVar35;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_98.d[3];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_d8.d[2];
      uVar48 = SUB168(auVar15 * auVar31,8);
      uVar42 = SUB168(auVar15 * auVar31,0);
      local_50 = uVar37 + uVar42;
      uVar42 = (ulong)CARRY8(uVar37,uVar42);
      uVar37 = uVar39 + uVar48;
      local_48._8_8_ =
           (ulong)(CARRY8(uVar38,uVar47) || CARRY8(uVar36,uVar35)) +
           (ulong)(CARRY8(uVar39,uVar48) || CARRY8(uVar37,uVar42));
      local_48._0_8_ = uVar37 + uVar42;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_98.d[3];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_d8.d[3];
      local_48 = auVar16 * auVar32 + local_48;
      secp256k1_scalar_reduce_512(&local_98,&local_78);
      secp256k1_scalar_set_b32(&local_d8,local_100[uVar41],&local_104);
      if (local_104 == 1) {
        return 0;
      }
      secp256k1_scalar_add(&local_98,&local_98,&local_d8);
      secp256k1_scalar_cond_negate(&local_98,(uint)(uVar41 < local_f8));
      secp256k1_scalar_add(&local_b8,&local_b8,&local_98);
      uVar41 = uVar41 + 1;
      if (uVar34 == uVar41) {
        secp256k1_scalar_negate(&local_b8,&local_b8);
        secp256k1_scalar_add(&local_d8,&local_d8,&local_b8);
        secp256k1_scalar_get_b32(local_100[uVar34 - 1],&local_d8);
        return 1;
      }
    }
  }
  else {
    secp256k1_pedersen_blind_generator_blind_sum_cold_4();
  }
  return 0;
}

Assistant:

int secp256k1_pedersen_blind_generator_blind_sum(const secp256k1_context* ctx, const uint64_t *value, const unsigned char* const* generator_blind, unsigned char* const* blinding_factor, size_t n_total, size_t n_inputs) {
    secp256k1_scalar sum;
    secp256k1_scalar tmp;
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(n_total == 0 || value != NULL);
    ARG_CHECK(n_total == 0 || generator_blind != NULL);
    ARG_CHECK(n_total == 0 || blinding_factor != NULL);
    ARG_CHECK(n_total > n_inputs);
    (void) ctx;

    if (n_total == 0) {
        return 1;
    }

    secp256k1_scalar_set_int(&sum, 0);
    for (i = 0; i < n_total; i++) {
        int overflow = 0;
        secp256k1_scalar addend;
        secp256k1_scalar_set_u64(&addend, value[i]);  /* s = v */

        secp256k1_scalar_set_b32(&tmp, generator_blind[i], &overflow);
        if (overflow == 1) {
            secp256k1_scalar_clear(&tmp);
            secp256k1_scalar_clear(&addend);
            secp256k1_scalar_clear(&sum);
            return 0;
        }
        secp256k1_scalar_mul(&addend, &addend, &tmp); /* s = vr */

        secp256k1_scalar_set_b32(&tmp, blinding_factor[i], &overflow);
        if (overflow == 1) {
            secp256k1_scalar_clear(&tmp);
            secp256k1_scalar_clear(&addend);
            secp256k1_scalar_clear(&sum);
            return 0;
        }
        secp256k1_scalar_add(&addend, &addend, &tmp); /* s = vr + r' */
        secp256k1_scalar_cond_negate(&addend, i < n_inputs);  /* s is negated if it's an input */
        secp256k1_scalar_add(&sum, &sum, &addend);    /* sum += s */
        secp256k1_scalar_clear(&addend);
    }

    /* Right now tmp has the last pedersen blinding factor. Subtract the sum from it. */
    secp256k1_scalar_negate(&sum, &sum);
    secp256k1_scalar_add(&tmp, &tmp, &sum);
    secp256k1_scalar_get_b32(blinding_factor[n_total - 1], &tmp);

    secp256k1_scalar_clear(&tmp);
    secp256k1_scalar_clear(&sum);
    return 1;
}